

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

wstring * __thiscall mjs::parser::get_label_abi_cxx11_(wstring *__return_storage_ptr__,parser *this)

{
  socklen_t *in_RCX;
  token t;
  undefined1 local_38 [40];
  
  if ((0 < (int)this->version_) && (this->line_break_skipped_ == false)) {
    accept((parser *)local_38,(int)this,(sockaddr *)0x2,in_RCX);
    if ((local_38._0_4_ == identifier) || (local_38._0_4_ == string_literal)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)__return_storage_ptr__,local_38._8_8_,
                 local_38._8_8_ + local_38._16_8_ * 4);
      token::destroy((token *)local_38);
      return __return_storage_ptr__;
    }
    if (local_38._0_4_ != eof) {
      __assert_fail("has_text()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                    0xd6,"const std::wstring &mjs::token::text() const");
    }
    token::destroy((token *)local_38);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)__return_storage_ptr__,L"");
  return __return_storage_ptr__;
}

Assistant:

std::wstring get_label() {
        // no line break before
        if (version_ >= version::es3 && !line_break_skipped_) {
            if (auto t = accept(token_type::identifier)) {
                return t.text();
            }
        }
        return L"";
    }